

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_nullscalefloats
              (float *fdata,long tilelen,int *idata,double scale,double zero,int nullcheck,
              float nullflagval,int nullval,int *status)

{
  float fVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  
  lVar2 = 0;
  if (0 < tilelen) {
    lVar2 = tilelen;
  }
  if (nullcheck == 1) {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      fVar1 = fdata[lVar3];
      if ((fVar1 != nullflagval) || (NAN(fVar1) || NAN(nullflagval))) {
        dVar5 = ((double)fVar1 - zero) / scale;
        if (-2147483648.49 <= dVar5) {
          if (dVar5 <= 2147483647.49) {
            if (0.0 <= dVar5) {
              dVar5 = dVar5 + 0.5;
            }
            else {
              dVar5 = dVar5 + -0.5;
            }
            idata[lVar3] = (int)dVar5;
          }
          else {
            *status = -0xb;
            idata[lVar3] = 0x7fffffff;
          }
        }
        else {
          *status = -0xb;
          idata[lVar3] = -0x80000000;
        }
      }
      else {
        idata[lVar3] = nullval;
      }
    }
  }
  else {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar5 = ((double)fdata[lVar3] - zero) / scale;
      if (-2147483648.49 <= dVar5) {
        if (dVar5 <= 2147483647.49) {
          if (0.0 <= dVar5) {
            dVar5 = dVar5 + 0.5;
          }
          else {
            dVar5 = dVar5 + -0.5;
          }
          iVar4 = (int)dVar5;
        }
        else {
          *status = -0xb;
          iVar4 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar4 = -0x80000000;
      }
      idata[lVar3] = iVar4;
    }
  }
  return *status;
}

Assistant:

int imcomp_nullscalefloats(
     float *fdata,
     long tilelen,
     int *idata, 
     double scale,
     double zero,
     int nullcheck,
     float nullflagval,
     int nullval,
     int *status)
/*
   do null value substitution  of the float array.
   If array value = nullflagval, then set the output value to FLOATNULLVALUE.
   Otherwise, inverse scale the integer value.
*/
{
    long ii;
    double dvalue;
    
    if (nullcheck == 1) /* must check for null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
        if (fdata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = (fdata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
      }
    }
    else  /* don't have to worry about null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
            dvalue = (fdata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
      }
    }
    return(*status);
}